

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

void __thiscall spv::Builder::transferAccessChainSwizzle(Builder *this,bool dynamic)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  iterator iVar4;
  pointer puVar5;
  Id IVar6;
  uint local_14;
  
  puVar2 = (this->accessChain).swizzle.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->accessChain).swizzle.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar1 = (this->accessChain).component;
  if ((ulong)((long)puVar3 - (long)puVar2) < 5 && (uVar1 != 0 || puVar3 != puVar2)) {
    if ((long)puVar3 - (long)puVar2 == 4) {
      if (uVar1 != 0) {
        __assert_fail("accessChain.component == NoResult",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                      ,0x10f2,"void spv::Builder::transferAccessChainSwizzle(bool)");
      }
      uVar1 = *puVar2;
      IVar6 = makeIntegerType(this,0x20,false);
      IVar6 = makeIntConstant(this,IVar6,uVar1,false);
      iVar4._M_current =
           (this->accessChain).indexChain.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->accessChain).indexChain.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&(this->accessChain).indexChain,iVar4,&local_14);
      }
      else {
        *iVar4._M_current = IVar6;
        (this->accessChain).indexChain.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      puVar5 = (this->accessChain).swizzle.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->accessChain).swizzle.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar5) {
        (this->accessChain).swizzle.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = puVar5;
      }
      (this->accessChain).preSwizzleBaseType = 0;
    }
    else if (dynamic && uVar1 != 0) {
      if (puVar3 != puVar2) {
        __assert_fail("accessChain.swizzle.size() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                      ,0x10f8,"void spv::Builder::transferAccessChainSwizzle(bool)");
      }
      iVar4._M_current =
           (this->accessChain).indexChain.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->accessChain).indexChain.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                   &(this->accessChain).indexChain,iVar4,&(this->accessChain).component);
      }
      else {
        *iVar4._M_current = uVar1;
        (this->accessChain).indexChain.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      (this->accessChain).component = 0;
      (this->accessChain).preSwizzleBaseType = 0;
    }
  }
  return;
}

Assistant:

void Builder::transferAccessChainSwizzle(bool dynamic)
{
    // non existent?
    if (accessChain.swizzle.size() == 0 && accessChain.component == NoResult)
        return;

    // too complex?
    // (this requires either a swizzle, or generating code for a dynamic component)
    if (accessChain.swizzle.size() > 1)
        return;

    // single component, either in the swizzle and/or dynamic component
    if (accessChain.swizzle.size() == 1) {
        assert(accessChain.component == NoResult);
        // handle static component selection
        accessChain.indexChain.push_back(makeUintConstant(accessChain.swizzle.front()));
        accessChain.swizzle.clear();
        accessChain.preSwizzleBaseType = NoType;
    } else if (dynamic && accessChain.component != NoResult) {
        assert(accessChain.swizzle.size() == 0);
        // handle dynamic component
        accessChain.indexChain.push_back(accessChain.component);
        accessChain.preSwizzleBaseType = NoType;
        accessChain.component = NoResult;
    }
}